

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_mp3_init_internal
                    (ma_dr_mp3 *pMP3,ma_dr_mp3_read_proc onRead,ma_dr_mp3_seek_proc onSeek,
                    void *pUserData,ma_allocation_callbacks *pAllocationCallbacks)

{
  _func_void_ptr_size_t_void_ptr *p_Var1;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var2;
  _func_void_void_ptr_void_ptr *p_Var3;
  ma_uint32 mVar4;
  ma_bool32 mVar5;
  
  (pMP3->decoder).header[0] = '\0';
  pMP3->onRead = onRead;
  pMP3->onSeek = onSeek;
  pMP3->pUserData = pUserData;
  if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
    (pMP3->allocationCallbacks).pUserData = (void *)0x0;
    (pMP3->allocationCallbacks).onMalloc = ma_dr_mp3__malloc_default;
    (pMP3->allocationCallbacks).onRealloc = ma_dr_mp3__realloc_default;
    (pMP3->allocationCallbacks).onFree = ma_dr_mp3__free_default;
  }
  else {
    p_Var1 = pAllocationCallbacks->onMalloc;
    p_Var2 = pAllocationCallbacks->onRealloc;
    p_Var3 = pAllocationCallbacks->onFree;
    (pMP3->allocationCallbacks).pUserData = pAllocationCallbacks->pUserData;
    (pMP3->allocationCallbacks).onMalloc = p_Var1;
    (pMP3->allocationCallbacks).onRealloc = p_Var2;
    (pMP3->allocationCallbacks).onFree = p_Var3;
    if (p_Var3 == (_func_void_void_ptr_void_ptr *)0x0) {
      return 0;
    }
    if (p_Var1 == (_func_void_ptr_size_t_void_ptr *)0x0 &&
        p_Var2 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
      return 0;
    }
  }
  mVar4 = ma_dr_mp3_decode_next_frame_ex(pMP3,(ma_dr_mp3d_sample_t *)pMP3->pcmFrames);
  if (mVar4 == 0) {
    mVar5 = 0;
    if ((pMP3->pData != (ma_uint8 *)0x0) &&
       (p_Var3 = (pMP3->allocationCallbacks).onFree, p_Var3 != (_func_void_void_ptr_void_ptr *)0x0))
    {
      (*p_Var3)(pMP3->pData,(pMP3->allocationCallbacks).pUserData);
    }
  }
  else {
    pMP3->channels = pMP3->mp3FrameChannels;
    pMP3->sampleRate = pMP3->mp3FrameSampleRate;
    mVar5 = 1;
  }
  return mVar5;
}

Assistant:

static ma_bool32 ma_dr_mp3_init_internal(ma_dr_mp3* pMP3, ma_dr_mp3_read_proc onRead, ma_dr_mp3_seek_proc onSeek, void* pUserData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    MA_DR_MP3_ASSERT(pMP3 != NULL);
    MA_DR_MP3_ASSERT(onRead != NULL);
    ma_dr_mp3dec_init(&pMP3->decoder);
    pMP3->onRead = onRead;
    pMP3->onSeek = onSeek;
    pMP3->pUserData = pUserData;
    pMP3->allocationCallbacks = ma_dr_mp3_copy_allocation_callbacks_or_defaults(pAllocationCallbacks);
    if (pMP3->allocationCallbacks.onFree == NULL || (pMP3->allocationCallbacks.onMalloc == NULL && pMP3->allocationCallbacks.onRealloc == NULL)) {
        return MA_FALSE;
    }
    if (ma_dr_mp3_decode_next_frame(pMP3) == 0) {
        ma_dr_mp3__free_from_callbacks(pMP3->pData, &pMP3->allocationCallbacks);
        return MA_FALSE;
    }
    pMP3->channels   = pMP3->mp3FrameChannels;
    pMP3->sampleRate = pMP3->mp3FrameSampleRate;
    return MA_TRUE;
}